

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<double> *value)

{
  FloatProxy<double> *os_00;
  int iVar1;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_30;
  streamsize local_28;
  streamsize saved_precision;
  double float_val;
  FloatProxy<double> *value_local;
  ostream *os_local;
  
  float_val = (double)value;
  value_local = (FloatProxy<double> *)os;
  saved_precision = (streamsize)FloatProxy<double>::getAsFloat(value);
  iVar1 = std::fpclassify((double)saved_precision);
  os_00 = value_local;
  if ((iVar1 == 2) || (iVar1 == 4)) {
    local_28 = std::ios_base::precision
                         ((ios_base *)
                          ((long)&value_local->data_ + *(long *)(value_local->data_ - 0x18)));
    std::ios_base::precision
              ((ios_base *)((long)&value_local->data_ + *(long *)(value_local->data_ - 0x18)),0x11);
    std::ostream::operator<<(value_local,(double)saved_precision);
    std::ios_base::precision
              ((ios_base *)((long)&value_local->data_ + *(long *)(value_local->data_ - 0x18)),
               local_28);
  }
  else {
    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
    ::HexFloat(&local_30,(FloatProxy<double>)*(uint_type *)float_val);
    operator<<((ostream *)os_00,&local_30);
  }
  return (ostream *)value_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}